

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UnicodeAddExceptions(Unicode61Tokenizer *p,char *z,int bTokenChars)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  uchar *puVar5;
  bool bVar6;
  int local_54;
  int i;
  int bToken;
  u32 iCode;
  uchar *zTerm;
  uchar *zCsr;
  int nNew;
  int *aNew;
  int local_20;
  int n;
  int rc;
  int bTokenChars_local;
  char *z_local;
  Unicode61Tokenizer *p_local;
  
  local_20 = 0;
  sVar3 = strlen(z);
  iVar1 = (int)sVar3;
  if (0 < iVar1) {
    piVar4 = (int *)sqlite3_realloc64(p->aiException,(long)(iVar1 + p->nException) << 2);
    if (piVar4 == (int *)0x0) {
      local_20 = 7;
    }
    else {
      zCsr._4_4_ = p->nException;
      zTerm = (uchar *)z;
      while (zTerm < z + iVar1) {
        puVar5 = zTerm + 1;
        i = (int)*zTerm;
        zTerm = puVar5;
        if (0xbf < (uint)i) {
          i = (int)""[i - 0xc0];
          while( true ) {
            bVar6 = false;
            if (zTerm != (uchar *)(z + iVar1)) {
              bVar6 = (*zTerm & 0xc0) == 0x80;
            }
            if (!bVar6) break;
            i = i * 0x40 + (*zTerm & 0x3f);
            zTerm = zTerm + 1;
          }
          if ((((uint)i < 0x80) || ((i & 0xfffff800U) == 0xd800)) || ((i & 0xfffffffeU) == 0xfffe))
          {
            i = 0xfffd;
          }
        }
        if ((uint)i < 0x80) {
          p->aTokenChar[(uint)i] = (uchar)bTokenChars;
        }
        else {
          iVar2 = sqlite3Fts5UnicodeCategory(i);
          if (((uint)p->aCategory[iVar2] != bTokenChars) &&
             (iVar2 = sqlite3Fts5UnicodeIsdiacritic(i), iVar2 == 0)) {
            for (local_54 = 0; (local_54 < zCsr._4_4_ && ((uint)piVar4[local_54] <= (uint)i));
                local_54 = local_54 + 1) {
            }
            memmove(piVar4 + (local_54 + 1),piVar4 + local_54,(long)(zCsr._4_4_ - local_54) << 2);
            piVar4[local_54] = i;
            zCsr._4_4_ = zCsr._4_4_ + 1;
          }
        }
      }
      p->aiException = piVar4;
      p->nException = zCsr._4_4_;
    }
  }
  return local_20;
}

Assistant:

static int fts5UnicodeAddExceptions(
  Unicode61Tokenizer *p,          /* Tokenizer object */
  const char *z,                  /* Characters to treat as exceptions */
  int bTokenChars                 /* 1 for 'tokenchars', 0 for 'separators' */
){
  int rc = SQLITE_OK;
  int n = (int)strlen(z);
  int *aNew;

  if( n>0 ){
    aNew = (int*)sqlite3_realloc64(p->aiException,
                                   (n+p->nException)*sizeof(int));
    if( aNew ){
      int nNew = p->nException;
      const unsigned char *zCsr = (const unsigned char*)z;
      const unsigned char *zTerm = (const unsigned char*)&z[n];
      while( zCsr<zTerm ){
        u32 iCode;
        int bToken;
        READ_UTF8(zCsr, zTerm, iCode);
        if( iCode<128 ){
          p->aTokenChar[iCode] = (unsigned char)bTokenChars;
        }else{
          bToken = p->aCategory[sqlite3Fts5UnicodeCategory(iCode)];
          assert( (bToken==0 || bToken==1) ); 
          assert( (bTokenChars==0 || bTokenChars==1) );
          if( bToken!=bTokenChars && sqlite3Fts5UnicodeIsdiacritic(iCode)==0 ){
            int i;
            for(i=0; i<nNew; i++){
              if( (u32)aNew[i]>iCode ) break;
            }
            memmove(&aNew[i+1], &aNew[i], (nNew-i)*sizeof(int));
            aNew[i] = iCode;
            nNew++;
          }
        }
      }
      p->aiException = aNew;
      p->nException = nNew;
    }else{
      rc = SQLITE_NOMEM;
    }
  }

  return rc;
}